

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::SampleCoverageCase::test(SampleCoverageCase *this)

{
  TestContext *pTVar1;
  StateVerifier *pSVar2;
  bool invert_00;
  float fVar3;
  int iStack_74;
  GLboolean invert;
  GLfloat reference;
  int i;
  int numIterations;
  int ndx_1;
  float clampTests [4];
  int local_4c;
  GLfloat GStack_48;
  int ndx;
  float fixedTests [4];
  undefined1 local_20 [8];
  Random rnd;
  SampleCoverageCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
  ApiCase::expectError(&this->super_ApiCase,0);
  _GStack_48 = 0x3f00000000000000;
  fixedTests[0] = 0.45;
  fixedTests[1] = 0.55;
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    glu::CallLogWrapper::glSampleCoverage
              (&(this->super_ApiCase).super_CallLogWrapper,(&GStack_48)[local_4c],'\0');
    (*this->m_verifier->_vptr_StateVerifier[2])
              ((&GStack_48)[local_4c],this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  _numIterations = 0xbfc00000bf800000;
  clampTests[0] = 1.45;
  clampTests[1] = 3.55;
  for (i = 0; i < 4; i = i + 1) {
    glu::CallLogWrapper::glSampleCoverage
              (&(this->super_ApiCase).super_CallLogWrapper,(GLfloat)(&numIterations)[i],'\0');
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pSVar2 = this->m_verifier;
    fVar3 = de::clamp<float>((float)(&numIterations)[i],0.0,1.0);
    (*pSVar2->_vptr_StateVerifier[2])(fVar3,pSVar2,pTVar1,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  for (iStack_74 = 0; iStack_74 < 0x78; iStack_74 = iStack_74 + 1) {
    fVar3 = de::Random::getFloat((Random *)local_20,0.0,1.0);
    invert_00 = de::Random::getBool((Random *)local_20);
    glu::CallLogWrapper::glSampleCoverage
              (&(this->super_ApiCase).super_CallLogWrapper,fVar3,invert_00);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (fVar3,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, 1.0f);
		expectError(GL_NO_ERROR);

		{
			const float fixedTests[] =
			{
				0.0f, 0.5f, 0.45f, 0.55f
			};
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
			{
				glSampleCoverage(fixedTests[ndx], GL_FALSE);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, fixedTests[ndx]);
				expectError(GL_NO_ERROR);
			}
		}

		{
			const float clampTests[] =
			{
				-1.0f, -1.5f, 1.45f, 3.55f
			};
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(clampTests); ++ndx)
			{
				glSampleCoverage(clampTests[ndx], GL_FALSE);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, de::clamp(clampTests[ndx], 0.0f, 1.0f));
				expectError(GL_NO_ERROR);
			}
		}

		{
			const int numIterations = 120;
			for (int i = 0; i < numIterations; ++i)
			{
				GLfloat		reference	= rnd.getFloat(0, 1);
				GLboolean	invert		= rnd.getBool() ? GL_TRUE : GL_FALSE;

				glSampleCoverage(reference, invert);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, reference);
				expectError(GL_NO_ERROR);
			}
		}
	}